

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void singlevar(LexState *ls,expdesc *var)

{
  FuncState *fs_00;
  int iVar1;
  TString *n;
  FuncState *fs;
  TString *varname;
  expdesc *var_local;
  LexState *ls_local;
  
  n = str_checkname(ls);
  fs_00 = ls->fs;
  iVar1 = singlevaraux(fs_00,n,var,1);
  if (iVar1 == 8) {
    iVar1 = luaK_stringK(fs_00,n);
    (var->u).s.info = iVar1;
  }
  return;
}

Assistant:

static void singlevar(LexState*ls,expdesc*var){
TString*varname=str_checkname(ls);
FuncState*fs=ls->fs;
if(singlevaraux(fs,varname,var,1)==VGLOBAL)
var->u.s.info=luaK_stringK(fs,varname);
}